

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::pawn_caps(Movegen *this,U64 *left,U64 *right,U64 *ep_left,U64 *ep_right)

{
  uint uVar1;
  code *local_60;
  code *local_58;
  Row r;
  _func_void_U64_ptr *se;
  _func_void_U64_ptr *sw;
  U64 *ep_right_local;
  U64 *ep_left_local;
  U64 *right_local;
  U64 *left_local;
  Movegen *this_local;
  
  if (this->pawns != 0) {
    *left = this->pawns & *(ulong *)(bitboards::pawnmaskleft + (ulong)this->us * 8);
    *right = this->pawns & *(ulong *)(bitboards::pawnmaskright + (ulong)this->us * 8);
    if (this->us == white) {
      local_58 = anon_unknown.dwarf_8003e::shift<(Dir)4>;
    }
    else {
      local_58 = anon_unknown.dwarf_8003e::shift<(Dir)7>;
    }
    if (this->us == white) {
      local_60 = anon_unknown.dwarf_8003e::shift<(Dir)5>;
    }
    else {
      local_60 = anon_unknown.dwarf_8003e::shift<(Dir)6>;
    }
    if (*left != 0) {
      (*local_60)(left);
      *left = this->ctarget & *left;
    }
    if (*right != 0) {
      (*local_58)(right);
      *right = this->ctarget & *right;
    }
    if (this->eps != no_square) {
      uVar1 = 3;
      if (this->us == white) {
        uVar1 = 4;
      }
      *ep_left = this->pawns & *(ulong *)(bitboards::pawnmaskleft + (ulong)this->us * 8) &
                 (&bitboards::row)[uVar1];
      *ep_right = this->pawns & *(ulong *)(bitboards::pawnmaskright + (ulong)this->us * 8) &
                  (&bitboards::row)[uVar1];
      if (*ep_left != 0) {
        (*local_60)(ep_left);
        *ep_left = (&bitboards::squares)[this->eps] & *ep_left;
      }
      if (*ep_right != 0) {
        (*local_58)(ep_right);
        *ep_right = (&bitboards::squares)[this->eps] & *ep_right;
      }
    }
  }
  return;
}

Assistant:

inline void Movegen::pawn_caps(U64& left, U64& right, U64& ep_left, U64& ep_right) {

	if (pawns == 0ULL) return;

	// normal captures - non promotions
	left = pawns & bitboards::pawnmaskleft[us];
	right = pawns & bitboards::pawnmaskright[us];

	auto sw = (us == white ? shift<NW> : shift<SE>);
	auto se = (us == white ? shift<NE> : shift<SW>);

	if (left != 0ULL) {
		se(left);
		left &= ctarget;
	}

	if (right != 0ULL) {
		sw(right);
		right &= ctarget;
	}

	// ep captures - evasions are checked individually
	if (eps == Square::no_square) return;
	auto r = (us == white ? Row::r5 : Row::r4);
	ep_left = pawns & bitboards::pawnmaskleft[us] & bitboards::row[r];
	ep_right = pawns & bitboards::pawnmaskright[us] & bitboards::row[r];

	if (ep_left != 0ULL) {
		se(ep_left);
		ep_left &= bitboards::squares[eps];
	}

	if (ep_right != 0ULL) {
		sw(ep_right);
		ep_right &= bitboards::squares[eps];
	}
}